

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O3

void __thiscall
capnp::writePackedMessage
          (capnp *this,OutputStream *output,
          ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  BufferedOutputStream *bufferedOutputPtr;
  capnp *this_00;
  size_t sVar1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<unsigned_char> buffer_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  BufferedOutputStreamWrapper bufferedOutput;
  byte buffer [8192];
  BufferedOutputStreamWrapper local_2070;
  uchar local_2028 [8192];
  
  segments_00.ptr = segments.ptr;
  sVar1 = 0;
  this_00 = (capnp *)__dynamic_cast(this,&kj::OutputStream::typeinfo,
                                    &kj::BufferedOutputStream::typeinfo);
  if (this_00 != (capnp *)0x0) {
    segments_00.size_ = sVar1;
    writePackedMessage(this_00,(BufferedOutputStream *)output,segments_00);
    return;
  }
  memset(local_2028,0,0x2000);
  buffer_00.size_ = 0x2000;
  buffer_00.ptr = local_2028;
  sVar1 = 0x2000;
  kj::BufferedOutputStreamWrapper::BufferedOutputStreamWrapper
            (&local_2070,(OutputStream *)this,buffer_00);
  segments_01.size_ = sVar1;
  segments_01.ptr = segments_00.ptr;
  writePackedMessage((capnp *)&local_2070,(BufferedOutputStream *)output,segments_01);
  kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper(&local_2070);
  return;
}

Assistant:

void writePackedMessage(kj::OutputStream& output,
                        kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_IF_SOME(bufferedOutputPtr, kj::dynamicDowncastIfAvailable<kj::BufferedOutputStream>(output)) {
    writePackedMessage(bufferedOutputPtr, segments);
  } else {
    byte buffer[8192]{};
    kj::BufferedOutputStreamWrapper bufferedOutput(output, kj::arrayPtr(buffer, sizeof(buffer)));
    writePackedMessage(bufferedOutput, segments);
  }